

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_77::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  Fault local_40;
  Fault f_1;
  Fault local_28;
  Fault f;
  uint64_t requested_local;
  uint64_t amount_local;
  LimitedInputStream *this_local;
  
  f.exception = (Exception *)requested;
  if (this->limit < amount) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x48f,FAILED,"limit >= amount","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  this->limit = this->limit - amount;
  if (this->limit == 0) {
    Own<kj::AsyncInputStream>::operator=(&this->inner,(void *)0x0);
  }
  else if (amount < requested) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x494,FAILED,(char *)0x0,"\"pipe ended prematurely\"",
               (char (*) [23])"pipe ended prematurely");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  return;
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      KJ_FAIL_REQUIRE("pipe ended prematurely");
    }
  }